

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  ulong uVar4;
  FieldDescriptor **ppFVar5;
  FieldGenerator *pFVar6;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  int i;
  int iVar7;
  long lVar8;
  char *pcVar9;
  Printer *this_00;
  int i_1;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  long lVar10;
  ZeroCopyOutputStream *pZVar11;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  allocator<char> local_91;
  undefined1 local_90 [8];
  _Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  local_88;
  string local_70;
  string local_50;
  
  local_90 = (undefined1  [8])anon_unknown_5::SortFieldsByNumber(this->descriptor_);
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar10 = 0;
  lVar8 = 0;
  while( true ) {
    ppEVar3 = local_88._M_impl.super__Vector_impl_data._M_finish;
    ppEVar2 = local_88._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)(this->descriptor_ + 0x58) <= lVar8) break;
    local_70._M_dataplus._M_p = (pointer)(*(long *)(this->descriptor_ + 0x60) + lVar10);
    std::
    vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
    ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
              ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                *)&local_88,(ExtensionRange **)&local_70);
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + 8;
  }
  if (local_88._M_impl.super__Vector_impl_data._M_start !=
      local_88._M_impl.super__Vector_impl_data._M_finish) {
    lVar10 = (long)local_88._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88._M_impl.super__Vector_impl_data._M_start;
    uVar4 = lVar10 >> 3;
    lVar8 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::(anonymous_namespace)::ExtensionRangeOrdering>>
              (local_88._M_impl.super__Vector_impl_data._M_start,
               local_88._M_impl.super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar10 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::(anonymous_namespace)::ExtensionRangeOrdering>>
                (ppEVar2,ppEVar3);
    }
    else {
      pZVar11 = (ZeroCopyOutputStream *)(ppEVar2 + 0x10);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::(anonymous_namespace)::ExtensionRangeOrdering>>
                (ppEVar2,pZVar11);
      for (; pZVar11 != (ZeroCopyOutputStream *)ppEVar3; pZVar11 = pZVar11 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::java::(anonymous_namespace)::ExtensionRangeOrdering>>
                  (pZVar11);
      }
    }
  }
  io::Printer::Print(printer,
                     "public void writeTo(com.google.protobuf.CodedOutputStream output)\n                    throws java.io.IOException {\n"
                    );
  io::Printer::Indent(printer);
  this_00 = printer;
  io::Printer::Print(printer,"getSerializedSize();\n");
  pDVar1 = this->descriptor_;
  if (0 < *(int *)(pDVar1 + 0x58)) {
    if (*(char *)(*(long *)(pDVar1 + 0x20) + 0x58) == '\x01') {
      pcVar9 = "";
      if (*(int *)(*(long *)(*(long *)(pDVar1 + 0x10) + 0x88) + 0x50) == 3) {
        pcVar9 = "Lite";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar9,&local_91);
      ClassName_abi_cxx11_(&local_50,(java *)this->descriptor_,descriptor);
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$lite$\n  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n    newMessageSetExtensionWriter();\n"
                         ,"lite",&local_70,"classname",&local_50);
    }
    else {
      pcVar9 = "";
      if (*(int *)(*(long *)(*(long *)(pDVar1 + 0x10) + 0x88) + 0x50) == 3) {
        pcVar9 = "Lite";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar9,&local_91);
      ClassName_abi_cxx11_(&local_50,(java *)this->descriptor_,descriptor_00);
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$lite$\n  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n    newExtensionWriter();\n"
                         ,"lite",&local_70,"classname",&local_50);
    }
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = (Printer *)&local_70;
    std::__cxx11::string::~string((string *)this_00);
  }
  iVar7 = 0;
  uVar4 = 0;
LAB_001c0fa5:
  lVar8 = (long)iVar7;
  uVar4 = (ulong)(int)uVar4;
  do {
    pDVar1 = this->descriptor_;
    if ((*(int *)(pDVar1 + 0x2c) <= iVar7) &&
       ((ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4)) {
      if (*(int *)(*(long *)(*(long *)(pDVar1 + 0x10) + 0x88) + 0x50) != 3) {
        pcVar9 = "getUnknownFields().writeTo(output);\n";
        if (*(char *)(*(long *)(pDVar1 + 0x20) + 0x58) != '\0') {
          pcVar9 = "getUnknownFields().writeAsMessageSetTo(output);\n";
        }
        io::Printer::Print(printer,pcVar9);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,
                         "}\n\nprivate int memoizedSerializedSize = -1;\npublic int getSerializedSize() {\n  int size = memoizedSerializedSize;\n  if (size != -1) return size;\n\n  size = 0;\n"
                        );
      io::Printer::Indent(printer);
      for (lVar8 = 0; pDVar1 = this->descriptor_, lVar8 < *(int *)(pDVar1 + 0x2c); lVar8 = lVar8 + 1
          ) {
        ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_90,
                             lVar8);
        pFVar6 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar5);
        (*pFVar6->_vptr_FieldGenerator[0xf])(pFVar6,printer);
      }
      if (0 < *(int *)(pDVar1 + 0x58)) {
        pcVar9 = "size += extensionsSerializedSize();\n";
        if (*(char *)(*(long *)(pDVar1 + 0x20) + 0x58) != '\0') {
          pcVar9 = "size += extensionsSerializedSizeAsMessageSet();\n";
        }
        io::Printer::Print(printer,pcVar9);
      }
      if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
        pcVar9 = "size += getUnknownFields().getSerializedSize();\n";
        if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x58) != '\0') {
          pcVar9 = "size += getUnknownFields().getSerializedSizeAsMessageSet();\n";
        }
        io::Printer::Print(printer,pcVar9);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  memoizedSerializedSize = size;\n  return size;\n}\n\n");
      io::Printer::Print(printer,
                         "private static final long serialVersionUID = 0L;\n@java.lang.Override\nprotected java.lang.Object writeReplace()\n    throws java.io.ObjectStreamException {\n  return super.writeReplace();\n}\n\n"
                        );
      std::
      _Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::~_Vector_base(&local_88);
      internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
                ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_90);
      return;
    }
    if (iVar7 == *(int *)(pDVar1 + 0x2c)) {
      GenerateSerializeOneExtensionRange
                ((MessageGenerator *)this_00,printer,
                 (ExtensionRange *)
                 ((ZeroCopyOutputStream *)
                 (local_88._M_impl.super__Vector_impl_data._M_start + uVar4))->
                 _vptr_ZeroCopyOutputStream);
    }
    else {
      if (uVar4 == (long)local_88._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3) {
        ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_90,
                             lVar8);
        this_00 = (Printer *)this;
        GenerateSerializeOneField(this,printer,*ppFVar5);
        goto LAB_001c1050;
      }
      this_00 = (Printer *)local_90;
      ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_90,lVar8
                          );
      if (*(int *)(*ppFVar5 + 0x28) <
          ((ExtensionRange *)
          ((ZeroCopyOutputStream *)(local_88._M_impl.super__Vector_impl_data._M_start + uVar4))->
          _vptr_ZeroCopyOutputStream)->start) break;
      GenerateSerializeOneExtensionRange
                ((MessageGenerator *)this_00,printer,
                 (ExtensionRange *)
                 ((ZeroCopyOutputStream *)
                 (local_88._M_impl.super__Vector_impl_data._M_start + uVar4))->
                 _vptr_ZeroCopyOutputStream);
    }
    uVar4 = uVar4 + 1;
  } while( true );
  ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                      ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_90,lVar8);
  this_00 = (Printer *)this;
  GenerateSerializeOneField(this,printer,*ppFVar5);
LAB_001c1050:
  iVar7 = iVar7 + 1;
  goto LAB_001c0fa5;
}

Assistant:

void MessageGenerator::
GenerateMessageSerializationMethods(io::Printer* printer) {
  scoped_array<const FieldDescriptor*> sorted_fields(
    SortFieldsByNumber(descriptor_));

  vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  sort(sorted_extensions.begin(), sorted_extensions.end(),
       ExtensionRangeOrdering());

  printer->Print(
    "public void writeTo(com.google.protobuf.CodedOutputStream output)\n"
    "                    throws java.io.IOException {\n");
  printer->Indent();
  // writeTo(CodedOutputStream output) might be invoked without
  // getSerializedSize() ever being called, but we need the memoized
  // sizes in case this message has packed fields. Rather than emit checks for
  // each packed field, just call getSerializedSize() up front for all messages.
  // In most cases, getSerializedSize() will have already been called anyway by
  // one of the wrapper writeTo() methods, making this call cheap.
  printer->Print(
    "getSerializedSize();\n");

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$lite$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n"
        "    newMessageSetExtensionWriter();\n",
        "lite", HasDescriptorMethods(descriptor_) ? "" : "Lite",
        "classname", ClassName(descriptor_));
    } else {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$lite$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n"
        "    newExtensionWriter();\n",
        "lite", HasDescriptorMethods(descriptor_) ? "" : "Lite",
        "classname", ClassName(descriptor_));
    }
  }

  // Merge the fields and the extension ranges, both sorted by field number.
  for (int i = 0, j = 0;
       i < descriptor_->field_count() || j < sorted_extensions.size();
       ) {
    if (i == descriptor_->field_count()) {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    } else if (j == sorted_extensions.size()) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else if (sorted_fields[i]->number() < sorted_extensions[j]->start) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    }
  }

  if (HasUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "getUnknownFields().writeAsMessageSetTo(output);\n");
    } else {
      printer->Print(
        "getUnknownFields().writeTo(output);\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n"
    "private int memoizedSerializedSize = -1;\n"
    "public int getSerializedSize() {\n"
    "  int size = memoizedSerializedSize;\n"
    "  if (size != -1) return size;\n"
    "\n"
    "  size = 0;\n");
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(sorted_fields[i]).GenerateSerializedSizeCode(printer);
  }

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += extensionsSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += extensionsSerializedSize();\n");
    }
  }

  if (HasUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += getUnknownFields().getSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += getUnknownFields().getSerializedSize();\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "  memoizedSerializedSize = size;\n"
    "  return size;\n"
    "}\n"
    "\n");

  printer->Print(
    "private static final long serialVersionUID = 0L;\n"
    "@java.lang.Override\n"
    "protected java.lang.Object writeReplace()\n"
    "    throws java.io.ObjectStreamException {\n"
    "  return super.writeReplace();\n"
    "}\n"
    "\n");
}